

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c++
# Opt level: O1

TlsCertificate * __thiscall
kj::TlsCertificate::operator=(TlsCertificate *this,TlsCertificate *other)

{
  EVP_PKEY *pkey;
  void *pvVar1;
  unsigned_long i;
  long lVar2;
  
  lVar2 = 0;
  do {
    pkey = (EVP_PKEY *)this->chain[lVar2];
    if (pkey == (EVP_PKEY *)other->chain[lVar2]) {
      if (pkey == (EVP_PKEY *)0x0) {
        return this;
      }
    }
    else {
      EVP_PKEY_free(pkey);
      pvVar1 = other->chain[lVar2];
      this->chain[lVar2] = pvVar1;
      if (pvVar1 != (void *)0x0) {
        X509_up_ref();
      }
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 10);
  return this;
}

Assistant:

TlsCertificate& TlsCertificate::operator=(const TlsCertificate& other) {
  for (auto i: kj::indices(chain)) {
    if (chain[i] != other.chain[i]) {
      EVP_PKEY_free(reinterpret_cast<EVP_PKEY*>(chain[i]));
      chain[i] = other.chain[i];
      if (chain[i] != nullptr) X509_up_ref(reinterpret_cast<X509*>(chain[i]));
    } else if (chain[i] == nullptr) {
      // end of both chains; quit early
      break;
    }
  }
  return *this;
}